

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_compressionStage_e ZVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t code;
  XXH64_hash_t XVar5;
  undefined4 *puVar6;
  char cVar7;
  ulong uVar8;
  ulong uVar9;
  size_t code_00;
  size_t sVar10;
  undefined4 *puVar11;
  
  code = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  uVar4 = ZSTD_isError(code);
  if (uVar4 != 0) {
    return code;
  }
  ZVar1 = cctx->stage;
  if (ZVar1 == ZSTDcs_created) {
    code_00 = 0xffffffffffffffc4;
  }
  else {
    puVar11 = (undefined4 *)((long)dst + code);
    uVar9 = dstCapacity - code;
    puVar6 = puVar11;
    if (ZVar1 != ZSTDcs_ending) {
      if (ZVar1 == ZSTDcs_init) {
        uVar4 = (cctx->appliedParams).fParams.contentSizeFlag;
        uVar2 = (cctx->appliedParams).fParams.checksumFlag;
        code_00 = 0xffffffffffffffba;
        if (0x11 < uVar9) {
          uVar3 = (cctx->appliedParams).cParams.windowLog;
          if ((cctx->appliedParams).format == ZSTD_f_zstd1) {
            *puVar11 = 0xfd2fb528;
            uVar8 = 4;
          }
          else {
            uVar8 = 0;
          }
          code_00 = uVar8 | 2;
          *(char *)((long)puVar11 + uVar8) = (uVar4 != 0) << 5 | (uVar2 != 0) << 2;
          cVar7 = '\0';
          if (uVar4 == 0) {
            cVar7 = (char)uVar3 * '\b' + -0x50;
          }
          *(char *)((long)puVar11 + uVar8 + 1) = cVar7;
        }
        uVar4 = ZSTD_isError(code_00);
        if (uVar4 != 0) goto LAB_001558ef;
        uVar9 = uVar9 - code_00;
        cctx->stage = ZSTDcs_ongoing;
        puVar6 = (undefined4 *)(code_00 + (long)puVar11);
      }
      code_00 = 0xffffffffffffffba;
      if (uVar9 < 4) goto LAB_001558ef;
      *puVar6 = 1;
      uVar9 = uVar9 - 3;
      puVar6 = (undefined4 *)((long)puVar6 + 3);
    }
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      XVar5 = XXH64_digest(&cctx->xxhState);
      code_00 = 0xffffffffffffffba;
      if (uVar9 < 4) goto LAB_001558ef;
      *puVar6 = (int)XVar5;
      puVar6 = puVar6 + 1;
    }
    cctx->stage = ZSTDcs_created;
    code_00 = (long)puVar6 - (long)puVar11;
  }
LAB_001558ef:
  uVar4 = ZSTD_isError(code_00);
  sVar10 = code_00;
  if ((uVar4 == 0) &&
     ((cctx->pledgedSrcSizePlusOne == 0 ||
      (sVar10 = 0xffffffffffffffb8, cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1)))) {
    sVar10 = code_00 + code;
  }
  return sVar10;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    if (ZSTD_isError(cSize)) return cSize;
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    if (ZSTD_isError(endResult)) return endResult;
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        if (cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1) {
            DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize = %u",
                (U32)cctx->pledgedSrcSizePlusOne-1, (U32)cctx->consumedSrcSize);
            return ERROR(srcSize_wrong);
    }   }
    return cSize + endResult;
}